

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_chain_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_sampler_context_t pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  time_meas tm;
  time_meas tStack_28;
  
  pvVar1 = smpl->ctx;
  time_meas::time_meas(&tStack_28,(int64_t *)((long)pvVar1 + 0x20),*pvVar1);
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  for (puVar3 = *(undefined8 **)((long)pvVar1 + 8); puVar3 != puVar2; puVar3 = puVar3 + 1) {
    llama_sampler_apply((llama_sampler *)*puVar3,cur_p);
  }
  time_meas::~time_meas(&tStack_28);
  return;
}

Assistant:

static void llama_sampler_chain_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    time_meas tm(chain->t_sample_us, chain->params.no_perf);

    for (auto * smpl : chain->samplers) {
        llama_sampler_apply(smpl, cur_p);
    }
}